

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

int __thiscall Bitmap::drawText(Bitmap *this,int32_t x,int32_t y,char *text)

{
  GlyphIterator *pGVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int32_t pixel;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  
  if (this->font == (GFXfont *)0x0) {
    iVar8 = -1;
  }
  else {
    bVar2 = *text;
    if (bVar2 == 0) {
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      do {
        iVar4 = Utf8Decoder::decode(&this->utf8,(uint)bVar2);
        if (0 < iVar4) {
          pixel = getPixelIndex(this,x,y);
          uVar5 = GlyphIterator::init(this->glyphIterator,(EVP_PKEY_CTX *)this->font);
          while ((char)uVar5 != '\0') {
            pGVar1 = this->glyphIterator;
            uVar5 = getPixelIndex(this,pixel,pGVar1->xOffset,pGVar1->yOffset);
            if ((-1 < (int)uVar5) && (uVar5 < (uint)this->length)) {
              bVar6 = (byte)uVar5 & 7;
              bVar2 = this->data[uVar5 >> 3];
              bVar7 = (byte)(-0x81 >> bVar6) & bVar2;
              if (pGVar1->value != false) {
                bVar7 = (byte)(0x80 >> bVar6) | bVar2;
              }
              this->data[uVar5 >> 3] = bVar7;
            }
            bVar3 = GlyphIterator::next(this->glyphIterator);
            uVar5 = (uint)bVar3;
          }
          iVar4 = this->glyphIterator->xAdvance;
          x = x + iVar4;
          iVar8 = iVar8 + iVar4;
        }
        text = (char *)((byte *)text + 1);
        bVar2 = *text;
      } while (bVar2 != 0);
    }
  }
  return iVar8;
}

Assistant:

int Bitmap::drawText(const int32_t x, const int32_t y, const char * text)
{
   int32_t cursor;
   int32_t pixel;
   int32_t width;
   int character;
   bool status;

   if (this->font == nullptr)
   {
      return -1;
   }

   width = 0;
   cursor = x;
   while ((character = (uint8_t)(*text++)) != 0)
   {
      //handle utf8 characters
      character = utf8.decode(character);
      //only for ASCII chars in range 1 ..127 and the suported UTF8 onces. Others will be skipped!
      if (character > 0)
      {
         //draw pixel for pixel of character
         const int32_t origin = getPixelIndex(cursor, y);
         status = glyphIterator->init(this->font, character);
         while (status)
         {
            //calculate pixel index to be set to the respective value
            pixel = getPixelIndex(origin, glyphIterator->xOffset, glyphIterator->yOffset);
            if (pixel >= 0)
            {
               //set pixel to its value
               setPixelValue(pixel, glyphIterator->value);
            }
            //select next pixel
            status = glyphIterator->next();
         }

         //increment cursor
         cursor += glyphIterator->xAdvance;
         width += glyphIterator->xAdvance;
      }
   }

   return width;
}